

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

SpeexResamplerState *
speex_resampler_init_frac
          (uint nb_channels,uint ratio_num,uint ratio_den,uint in_rate,uint out_rate,int quality,
          int *err)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int in_R9D;
  int *in_stack_00000008;
  int filter_err;
  SpeexResamplerState *st;
  SpeexResamplerState *in_stack_ffffffffffffffc8;
  SpeexResamplerState *local_28;
  SpeexResamplerState *in_stack_fffffffffffffff8;
  
  if ((((in_EDI == 0) || (in_ESI == 0)) || (in_EDX == 0)) || ((10 < in_R9D || (in_R9D < 0)))) {
    if (in_stack_00000008 != (int *)0x0) {
      *in_stack_00000008 = 3;
    }
  }
  else {
    local_28 = (SpeexResamplerState *)speex_alloc(0);
    if (local_28 == (SpeexResamplerState *)0x0) {
      if (in_stack_00000008 != (int *)0x0) {
        *in_stack_00000008 = 1;
      }
    }
    else {
      local_28->initialised = 0;
      local_28->started = 0;
      local_28->in_rate = 0;
      local_28->out_rate = 0;
      local_28->num_rate = 0;
      local_28->den_rate = 0;
      local_28->quality = -1;
      local_28->sinc_table_length = 0;
      local_28->mem_alloc_size = 0;
      local_28->filt_len = 0;
      local_28->mem = (spx_word16_t *)0x0;
      local_28->resampler_ptr = (resampler_basic_func)0x0;
      local_28->cutoff = 1.0;
      local_28->nb_channels = in_EDI;
      local_28->in_stride = 1;
      local_28->out_stride = 1;
      local_28->buffer_size = 0xa0;
      piVar2 = (int *)speex_alloc(0);
      local_28->last_sample = piVar2;
      if (piVar2 != (int *)0x0) {
        puVar3 = (uint *)speex_alloc(0);
        local_28->magic_samples = puVar3;
        if (puVar3 != (uint *)0x0) {
          puVar3 = (uint *)speex_alloc(0);
          local_28->samp_frac_num = puVar3;
          if (puVar3 != (uint *)0x0) {
            speex_resampler_set_quality(in_stack_ffffffffffffffc8,0);
            speex_resampler_set_rate_frac(in_stack_fffffffffffffff8,in_EDI,in_ESI,in_EDX,in_ECX);
            iVar1 = update_filter((SpeexResamplerState *)CONCAT44(out_rate,quality));
            if (iVar1 == 0) {
              local_28->initialised = 1;
            }
            else {
              speex_resampler_destroy((SpeexResamplerState *)0x11cfee);
              local_28 = (SpeexResamplerState *)0x0;
            }
            if (in_stack_00000008 != (int *)0x0) {
              *in_stack_00000008 = iVar1;
              return local_28;
            }
            return local_28;
          }
        }
      }
      if (in_stack_00000008 != (int *)0x0) {
        *in_stack_00000008 = 1;
      }
      speex_resampler_destroy((SpeexResamplerState *)0x11d033);
    }
  }
  return (SpeexResamplerState *)0x0;
}

Assistant:

EXPORT SpeexResamplerState *speex_resampler_init_frac(spx_uint32_t nb_channels, spx_uint32_t ratio_num, spx_uint32_t ratio_den, spx_uint32_t in_rate, spx_uint32_t out_rate, int quality, int *err)
{
   SpeexResamplerState *st;
   int filter_err;

   if (nb_channels == 0 || ratio_num == 0 || ratio_den == 0 || quality > 10 || quality < 0)
   {
      if (err)
         *err = RESAMPLER_ERR_INVALID_ARG;
      return NULL;
   }
   st = (SpeexResamplerState *)speex_alloc(sizeof(SpeexResamplerState));
   if (!st)
   {
      if (err)
         *err = RESAMPLER_ERR_ALLOC_FAILED;
      return NULL;
   }
   st->initialised = 0;
   st->started = 0;
   st->in_rate = 0;
   st->out_rate = 0;
   st->num_rate = 0;
   st->den_rate = 0;
   st->quality = -1;
   st->sinc_table_length = 0;
   st->mem_alloc_size = 0;
   st->filt_len = 0;
   st->mem = 0;
   st->resampler_ptr = 0;

   st->cutoff = 1.f;
   st->nb_channels = nb_channels;
   st->in_stride = 1;
   st->out_stride = 1;

   st->buffer_size = 160;

   /* Per channel data */
   if (!(st->last_sample = (spx_int32_t*)speex_alloc(nb_channels*sizeof(spx_int32_t))))
      goto fail;
   if (!(st->magic_samples = (spx_uint32_t*)speex_alloc(nb_channels*sizeof(spx_uint32_t))))
      goto fail;
   if (!(st->samp_frac_num = (spx_uint32_t*)speex_alloc(nb_channels*sizeof(spx_uint32_t))))
      goto fail;

   speex_resampler_set_quality(st, quality);
   speex_resampler_set_rate_frac(st, ratio_num, ratio_den, in_rate, out_rate);

   filter_err = update_filter(st);
   if (filter_err == RESAMPLER_ERR_SUCCESS)
   {
      st->initialised = 1;
   } else {
      speex_resampler_destroy(st);
      st = NULL;
   }
   if (err)
      *err = filter_err;

   return st;

fail:
   if (err)
      *err = RESAMPLER_ERR_ALLOC_FAILED;
   speex_resampler_destroy(st);
   return NULL;
}